

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void init_partition_search_state_params
               (MACROBLOCK *x,AV1_COMP *cpi,PartitionSearchState *part_search_state,int mi_row,
               int mi_col,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  _Bool _Var2;
  int iVar3;
  PartitionBlkParams *blk_params_00;
  int in_ECX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  int i;
  ModeCosts *mode_costs;
  CommonModeInfoParams *mi_params;
  PartitionBlkParams *blk_params;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  PARTITION_TYPE in_stack_ffffffffffffffa5;
  bool bVar4;
  BLOCK_SIZE in_stack_ffffffffffffffa6;
  bool bsize_00;
  bool local_59;
  int local_58;
  int local_54;
  
  blk_params_00 = (PartitionBlkParams *)(in_RDX + 1);
  blk_params_00->mi_step =
       "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R9B] / 2;
  *(int *)((long)in_RDX + 0xc) = in_ECX;
  *(int *)(in_RDX + 2) = in_R8D;
  *(int *)((long)in_RDX + 0x14) = in_ECX + blk_params_00->mi_step;
  *(int *)(in_RDX + 3) = in_R8D + blk_params_00->mi_step;
  *(uint *)((long)in_RDX + 0x1c) = (uint)block_size_wide[in_R9B];
  *(uint *)(in_RDX + 4) = (uint)block_size_wide[*(byte *)(in_RDI + 0x15250)];
  BVar1 = get_partition_subsize(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa5);
  *(BLOCK_SIZE *)((long)in_RDX + 0x31) = BVar1;
  *(undefined1 *)((long)in_RDX + 0x32) = *(undefined1 *)((long)in_RDX + 0x31);
  *(uint *)((long)in_RDX + 0x24) = (uint)(BLOCK_8X4 < in_R9B);
  *(BLOCK_SIZE *)(in_RDX + 6) = in_R9B;
  *(uint *)(in_RDX + 5) = (uint)(*(int *)((long)in_RDX + 0x14) < *(int *)(in_RSI + 0x3c194));
  *(uint *)((long)in_RDX + 0x2c) = (uint)((int)in_RDX[3] < *(int *)(in_RSI + 0x3c198));
  *in_RDX = in_RDI + 0x17204;
  iVar3 = frame_is_intra_only((AV1_COMMON *)(in_RSI + 0x3bf80));
  if ((iVar3 != 0) && (in_R9B == BLOCK_64X64)) {
    *(undefined4 *)*in_RDX = 0;
    *(undefined4 *)(*in_RDX + 4) = 0;
  }
  if (*(int *)((long)in_RDX + 0x24) == 0) {
    local_58 = 0;
  }
  else {
    local_58 = partition_plane_context((MACROBLOCKD *)(in_RDI + 0x1a0),in_ECX,in_R8D,in_R9B);
  }
  *(int *)(in_RDX + 0x28) = local_58;
  in_RDX[0x17] = in_RDI + 0x4230 + (long)(int)in_RDX[0x28] * 0x28;
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    *(undefined4 *)((long)in_RDX + (long)local_54 * 8 + 0x34) = 1;
    *(undefined4 *)(in_RDX + (long)local_54 + 7) = 1;
  }
  av1_init_rd_stats((RD_STATS *)(in_RDX + 0xb));
  in_RDX[0x18] = 0;
  memset(in_RDX + 0x19,0,0x20);
  memset(in_RDX + 0x1d,0,0x20);
  memset(in_RDX + 0x21,0,8);
  memset(in_RDX + 0x22,0,8);
  *(undefined4 *)(in_RDX + 0x27) = *(undefined4 *)(in_RDI + 0xbe4);
  *(undefined4 *)((long)in_RDX + 0x13c) = *(undefined4 *)(in_RDI + 0xbe8);
  *(undefined4 *)(in_RDX + 0x23) = 0;
  *(undefined4 *)((long)in_RDX + 300) = *(undefined4 *)((long)in_RDX + 0x24);
  local_59 = false;
  if ((*(byte *)(in_RSI + 0x426fe) & 1) != 0) {
    local_59 = *(int *)((long)in_RDX + 0x24) != 0;
  }
  *(uint *)(in_RDX + 0x25) = (uint)local_59;
  memset(in_RDX + 0x26,0,8);
  _Var2 = av1_blk_has_rows_and_cols(blk_params_00);
  *(uint *)((long)in_RDX + 0x11c) = (uint)_Var2;
  bsize_00 = false;
  if (((int)in_RDX[0x25] != 0) && (bsize_00 = false, *(int *)((long)in_RDX + 0x2c) != 0)) {
    BVar1 = get_partition_subsize(BLOCK_4X4,in_stack_ffffffffffffffa5);
    BVar1 = get_plane_block_size(BVar1,(int)in_RDX[0x27],*(int *)((long)in_RDX + 0x13c));
    bsize_00 = BVar1 != BLOCK_INVALID;
  }
  *(uint *)(in_RDX + 0x24) = (uint)bsize_00;
  bVar4 = false;
  if (((int)in_RDX[0x25] != 0) && (bVar4 = false, (int)in_RDX[5] != 0)) {
    BVar1 = get_partition_subsize(bsize_00,'\0');
    BVar1 = get_plane_block_size(BVar1,(int)in_RDX[0x27],*(int *)((long)in_RDX + 0x13c));
    bVar4 = BVar1 != BLOCK_INVALID;
  }
  *(uint *)((long)in_RDX + 0x124) = (uint)bVar4;
  *(undefined1 *)((long)in_RDX + 0x144) = 0;
  return;
}

Assistant:

static void init_partition_search_state_params(
    MACROBLOCK *x, AV1_COMP *const cpi, PartitionSearchState *part_search_state,
    int mi_row, int mi_col, BLOCK_SIZE bsize) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams *blk_params = &part_search_state->part_blk_params;
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;

  // Initialization of block size related parameters.
  blk_params->mi_step = mi_size_wide[bsize] / 2;
  blk_params->mi_row = mi_row;
  blk_params->mi_col = mi_col;
  blk_params->mi_row_edge = mi_row + blk_params->mi_step;
  blk_params->mi_col_edge = mi_col + blk_params->mi_step;
  blk_params->width = block_size_wide[bsize];
  blk_params->min_partition_size_1d =
      block_size_wide[x->sb_enc.min_partition_size];
  blk_params->subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
  blk_params->split_bsize2 = blk_params->subsize;
  blk_params->bsize_at_least_8x8 = (bsize >= BLOCK_8X8);
  blk_params->bsize = bsize;

  // Check if the partition corresponds to edge block.
  blk_params->has_rows = (blk_params->mi_row_edge < mi_params->mi_rows);
  blk_params->has_cols = (blk_params->mi_col_edge < mi_params->mi_cols);

  // Update intra partitioning related info.
  part_search_state->intra_part_info = &x->part_search_info;
  // Prepare for segmentation CNN-based partitioning for intra-frame.
  if (frame_is_intra_only(cm) && bsize == BLOCK_64X64) {
    part_search_state->intra_part_info->quad_tree_idx = 0;
    part_search_state->intra_part_info->cnn_output_valid = 0;
  }

  // Set partition plane context index.
  part_search_state->pl_ctx_idx =
      blk_params->bsize_at_least_8x8
          ? partition_plane_context(xd, mi_row, mi_col, bsize)
          : 0;

  // Partition cost buffer update
  ModeCosts *mode_costs = &x->mode_costs;
  part_search_state->partition_cost =
      mode_costs->partition_cost[part_search_state->pl_ctx_idx];

  // Initialize HORZ and VERT win flags as true for all split partitions.
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
    part_search_state->split_part_rect_win[i].rect_part_win[HORZ] = true;
    part_search_state->split_part_rect_win[i].rect_part_win[VERT] = true;
  }

  // Initialize the rd cost.
  av1_init_rd_stats(&part_search_state->this_rdc);

  // Initialize RD costs for partition types to 0.
  part_search_state->none_rd = 0;
  av1_zero(part_search_state->split_rd);
  av1_zero(part_search_state->rect_part_rd);

  // Initialize SPLIT partition to be not ready.
  av1_zero(part_search_state->is_split_ctx_is_ready);
  // Initialize HORZ and VERT partitions to be not ready.
  av1_zero(part_search_state->is_rect_ctx_is_ready);

  // Chroma subsampling.
  part_search_state->ss_x = x->e_mbd.plane[1].subsampling_x;
  part_search_state->ss_y = x->e_mbd.plane[1].subsampling_y;

  // Initialize partition search flags to defaults.
  part_search_state->terminate_partition_search = 0;
  part_search_state->do_square_split = blk_params->bsize_at_least_8x8;
  part_search_state->do_rectangular_split =
      cpi->oxcf.part_cfg.enable_rect_partitions &&
      blk_params->bsize_at_least_8x8;
  av1_zero(part_search_state->prune_rect_part);

  // Initialize allowed partition types for the partition block.
  part_search_state->partition_none_allowed =
      av1_blk_has_rows_and_cols(blk_params);
  part_search_state->partition_rect_allowed[HORZ] =
      part_search_state->do_rectangular_split && blk_params->has_cols &&
      get_plane_block_size(get_partition_subsize(bsize, PARTITION_HORZ),
                           part_search_state->ss_x,
                           part_search_state->ss_y) != BLOCK_INVALID;
  part_search_state->partition_rect_allowed[VERT] =
      part_search_state->do_rectangular_split && blk_params->has_rows &&
      get_plane_block_size(get_partition_subsize(bsize, PARTITION_VERT),
                           part_search_state->ss_x,
                           part_search_state->ss_y) != BLOCK_INVALID;

  // Reset the flag indicating whether a partition leading to a rdcost lower
  // than the bound best_rdc has been found.
  part_search_state->found_best_partition = false;

#if CONFIG_COLLECT_PARTITION_STATS
  init_partition_block_timing_stats(&part_search_state->part_timing_stats);
#endif  // CONFIG_COLLECT_PARTITION_STATS
}